

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_stor_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  byte *pbVar1;
  connectdata *pcVar2;
  curl_trc_feat *pcVar3;
  bool bVar4;
  CURLcode CVar5;
  _Bool connected;
  _Bool local_19;
  
  if (ftpcode < 400) {
    pcVar2 = data->conn;
    (pcVar2->proto).ftpc.state_saved = instate;
    if (((data->set).field_0x89d & 0x80) != 0) {
      bVar4 = false;
      _ftp_state(data,'\0');
      CVar5 = Curl_conn_connect(data,1,false,&local_19);
      if (CVar5 == CURLE_OK) {
        if (local_19 == false) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
              (0 < pcVar3->log_level)))) {
            Curl_infof(data,"Data conn was not available immediately");
          }
          pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
          *pbVar1 = *pbVar1 | 0x20;
          CVar5 = ftp_check_ctrl_on_data_wait(data);
          bVar4 = false;
        }
        else {
          pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
          *pbVar1 = *pbVar1 & 0xdf;
          bVar4 = true;
        }
      }
      if (!bVar4) {
        return CVar5;
      }
    }
    CVar5 = InitiateTransfer(data);
  }
  else {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    _ftp_state(data,'\0');
    CVar5 = CURLE_UPLOAD_FAILED;
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct Curl_easy *data,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode >= 400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    ftp_state(data, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    bool connected;

    ftp_state(data, FTP_STOP); /* no longer in STOR state */

    result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
    if(result)
      return result;

    if(!connected) {
      infof(data, "Data conn was not available immediately");
      ftpc->wait_data_conn = TRUE;
      return ftp_check_ctrl_on_data_wait(data);
    }
    ftpc->wait_data_conn = FALSE;
  }
  return InitiateTransfer(data);
}